

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O2

void WebRtcIsac_UpdateRateModel(RateModel *State,int StreamSize,int FrameSamples,double BottleNeck)

{
  double dVar1;
  double dVar2;
  
  State->InitCounter = 0;
  dVar2 = (((double)StreamSize * 8.0 * 1000.0) / BottleNeck + State->StillBuffered) -
          (double)(FrameSamples / 0x10);
  dVar1 = 0.0;
  if (0.0 <= dVar2) {
    dVar1 = dVar2;
  }
  State->StillBuffered = dVar1;
  return;
}

Assistant:

void WebRtcIsac_UpdateRateModel(
    RateModel *State,
    int StreamSize,                    /* bytes in bitstream */
    const int FrameSamples,            /* samples per frame */
    const double BottleNeck)        /* bottle neck rate; excl headers (bps) */
{
  double TransmissionTime;

  /* avoid the initial "high-rate" burst */
  State->InitCounter = 0;

  /* Update buffer delay */
  TransmissionTime = StreamSize * 8.0 * 1000.0 / BottleNeck;  /* ms */
  State->StillBuffered += TransmissionTime;
  State->StillBuffered -= (FrameSamples * 1000) / FS;     /* ms */
  if (State->StillBuffered < 0.0)
    State->StillBuffered = 0.0;

}